

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

string * __thiscall
pbrt::CameraSceneEntity::ToString_abi_cxx11_(string *__return_storage_ptr__,CameraSceneEntity *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::CameraTransform_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,
             "[ CameraSeneEntity name: %s parameters: %s loc: %s cameraTransform: %s medium: %s ]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             &(this->super_SceneEntity).parameters,&(this->super_SceneEntity).loc,
             &this->cameraTransform,&this->medium);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ CameraSeneEntity name: %s parameters: %s loc: %s "
                            "cameraTransform: %s medium: %s ]",
                            name, parameters, loc, cameraTransform, medium);
    }